

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O3

void __thiscall GibbsSamplerFromHDP::checkNumbers(GibbsSamplerFromHDP *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  pointer puVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_88;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_58;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_40;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_58,&this->_nkv);
  uVar1 = sum<unsigned_int>(&local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a0,&this->_nk);
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar3 = 0;
  }
  else {
    dVar8 = 0.0;
    puVar4 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      dVar8 = dVar8 + (double)*puVar4;
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    uVar3 = (uint)(long)dVar8;
  }
  bVar7 = true;
  if (uVar1 == uVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8,&this->_nk);
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar6 = 0;
    }
    else {
      dVar8 = 0.0;
      puVar4 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar8 = dVar8 + (double)*puVar4;
        puVar4 = puVar4 + 1;
      } while (puVar4 != local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      iVar6 = (int)(long)dVar8;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d0,&this->_nj);
    if (local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar2 = 0;
    }
    else {
      dVar8 = 0.0;
      puVar4 = local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar8 = dVar8 + (double)*puVar4;
        puVar4 = puVar4 + 1;
      } while (puVar4 != local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      iVar2 = (int)(long)dVar8;
    }
    bVar7 = true;
    if (iVar6 == iVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e8,&this->_nj);
      if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar1 = 0;
      }
      else {
        dVar8 = 0.0;
        puVar4 = local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          dVar8 = dVar8 + (double)*puVar4;
          puVar4 = puVar4 + 1;
        } while (puVar4 != local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
        uVar1 = (uint)(long)dVar8;
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_70,&this->_njt);
      uVar3 = sum<unsigned_int>(&local_70);
      bVar7 = true;
      if (uVar1 == uVar3) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector(&local_88,&this->_njt);
        uVar1 = sum<unsigned_int>(&local_88);
        std::
        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
        ::vector(&local_40,&this->_njtv);
        uVar3 = sum<unsigned_int>(&local_40);
        bVar7 = uVar1 != uVar3;
        std::
        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
        ::~vector(&local_40);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_88);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_70);
      if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_58);
  if ((((!bVar7) &&
       (((long)(this->_nkv).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->_nkv).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        (ulong)this->_K == 0)) &&
      (lVar5 = (long)(this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start, lVar5 >> 2 == (ulong)this->_K)) &&
     (lVar5 == (long)(this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start)) {
    return;
  }
  exit(0);
}

Assistant:

void GibbsSamplerFromHDP::checkNumbers(){//{{{
    if(sum(_nkv) != sum(_nk) || sum(_nk) != sum(_nj) || sum(_nj) != sum(_njt) || sum(_njt) != sum(_njtv))exit(0);
    if(_K != _nkv.size() || _nkv.size() != _mk.size() || _mk.size() != _nk.size())exit(0);
}